

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O1

void __thiscall HDualRow::choose_possible(HDualRow *this)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  int *piVar7;
  double *pdVar8;
  pointer pdVar9;
  pointer ppVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar3 = this->workModel->countUpdate;
  if (iVar3 < 10) {
    dVar14 = 1e-09;
  }
  else {
    dVar14 = *(double *)(&DAT_00157a40 + (ulong)(iVar3 < 0x14) * 8);
  }
  dVar2 = this->workModel->dblOption[2];
  this->workTheta = 1e+200;
  this->workCount = 0;
  iVar3 = this->packCount;
  if (0 < (long)iVar3) {
    dVar17 = this->workTheta;
    iVar12 = this->workCount;
    piVar6 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = this->workMove;
    pdVar8 = this->workDual;
    pdVar9 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar10 = (this->workData).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    uVar13 = -(ulong)(this->workDelta < 0.0);
    do {
      iVar4 = piVar6[lVar11];
      dVar15 = pdVar9[lVar11];
      iVar5 = piVar7[iVar4];
      dVar15 = (double)(~uVar13 & (ulong)dVar15 | (ulong)-dVar15 & uVar13) * (double)iVar5;
      if (dVar14 < dVar15) {
        iVar1 = iVar12 + 1;
        this->workCount = iVar1;
        ppVar10[iVar12].first = iVar4;
        ppVar10[iVar12].second = dVar15;
        dVar16 = (double)iVar5 * pdVar8[iVar4] + dVar2;
        iVar12 = iVar1;
        if (dVar16 < dVar15 * dVar17) {
          dVar17 = dVar16 / dVar15;
          this->workTheta = dVar17;
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar3 != lVar11);
  }
  return;
}

Assistant:

void HDualRow::choose_possible() {
    /**
     * Will determine the possible variables
     * Can be parallel.
     */
    const double Ta = workModel->countUpdate < 10 ? 1e-9 :
                      workModel->countUpdate < 20 ? 3e-8 : 1e-6;
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    const int sourceOut = workDelta < 0 ? -1 : 1;
    workTheta = HSOL_CONST_INF;
    workCount = 0;
    for (int i = 0; i < packCount; i++) {
        const int iCol = packIndex[i];
        const int move = workMove[iCol];
        const double alpha = packValue[i] * sourceOut * move;
        if (alpha > Ta) {
            workData[workCount++] = make_pair(iCol, alpha);
            const double relax = workDual[iCol] * move + Td;
            if (workTheta * alpha > relax)
                workTheta = relax / alpha;
        }
    }

}